

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_main_main.cpp
# Opt level: O2

int sc_elab_and_sim(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  int i;
  ulong __n;
  char CODENL [4];
  vector<char_*,_std::allocator<char_*>_> argv_copy;
  char MSGNL [15];
  char *local_1d0 [4];
  vector<char_*,_std::allocator<char_*>_> argv_call;
  
  argv_call.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sc_core::argc_orig = argc;
  sc_core::argv_orig = argv;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            (&argv_copy,(long)(argc + 1),(value_type *)&argv_call,(allocator_type *)local_1d0);
  uVar7 = 0;
  uVar6 = 0;
  if (0 < argc) {
    uVar6 = (ulong)(uint)argc;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    sVar3 = strlen(argv[uVar7]);
    __n = sVar3 + 1;
    pcVar4 = (char *)operator_new__(__n);
    argv_copy.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar7] = pcVar4;
    if (__n != 0) {
      memmove(argv_copy.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7],argv[uVar7],__n);
    }
  }
  sc_core::pln();
  sc_core::sc_in_action = 1;
  std::vector<char_*,_std::allocator<char_*>_>::vector(&argv_call,&argv_copy);
  iVar1 = sc_main(argc,argv_call.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
  sc_core::sc_in_action = 0;
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&argv_call.super__Vector_base<char_*,_std::allocator<char_*>_>);
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    if (argv_copy.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] != (char *)0x0) {
      operator_delete__(argv_copy.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7]);
    }
  }
  iVar2 = sc_core::sc_report_handler::get_count("/IEEE_Std_1666/deprecated");
  if (0 < iVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&argv_call);
    builtin_strncpy(MSGNL,"\n             ",0xf);
    builtin_strncpy(CODENL,"\n  ",4);
    poVar5 = std::operator<<((ostream *)
                             &argv_call.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             "You can turn off warnings about");
    poVar5 = std::operator<<(poVar5,MSGNL);
    poVar5 = std::operator<<(poVar5,"IEEE 1666 deprecated features by placing this method call");
    poVar5 = std::operator<<(poVar5,MSGNL);
    poVar5 = std::operator<<(poVar5,"as the first statement in your sc_main() function:\n");
    poVar5 = std::operator<<(poVar5,CODENL);
    poVar5 = std::operator<<(poVar5,"sc_core::sc_report_handler::set_actions( ");
    poVar5 = std::operator<<(poVar5,"\"");
    poVar5 = std::operator<<(poVar5,"/IEEE_Std_1666/deprecated");
    poVar5 = std::operator<<(poVar5,"\",");
    poVar5 = std::operator<<(poVar5,CODENL);
    poVar5 = std::operator<<(poVar5,"                                         ");
    poVar5 = std::operator<<(poVar5,"sc_core::SC_DO_NOTHING );");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::stringbuf::str();
    sc_core::sc_report_handler::report
              (SC_INFO,"/IEEE_Std_1666/deprecated",local_1d0[0],
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_main_main.cpp"
               ,0x83);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringstream::~stringstream((stringstream *)&argv_call);
  }
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&argv_copy.super__Vector_base<char_*,_std::allocator<char_*>_>);
  return iVar1;
}

Assistant:

int
sc_elab_and_sim( int argc, char* argv[] )
{
    int status = 1;
    argc_orig = argc;
    argv_orig = argv;

    // Copy argv into a new structure to prevent sc_main from modifying the
    // result returned from sc_argv.
    std::vector<char*> argv_copy(argc + 1, static_cast<char*>(NULL));
    for ( int i = 0; i < argc; ++i ) {
        std::size_t size = std::strlen(argv[i]) + 1;
        argv_copy[i] = new char[size];
        std::copy(argv[i], argv[i] + size, argv_copy[i]);
    }

    try
    {
        pln();

        // Perform initialization here
        sc_in_action = true;

        // copy array of pointers to keep allocated pointers for later release
        std::vector<char*> argv_call = argv_copy;
        status = sc_main( argc, &argv_call[0] );

        // Perform cleanup here
        sc_in_action = false;
    }
    catch( const sc_report& x )
    {
        sc_report_handler::get_handler()
            ( x, sc_report_handler::get_catch_actions() );
    }
    catch( ... )
    {
        // translate other escaping exceptions
        sc_report*  err_p = sc_handle_exception();
        if( err_p )
            sc_report_handler::get_handler()
                ( *err_p, sc_report_handler::get_catch_actions() );
        delete err_p;
    }

    for ( int i = 0; i < argc; ++i ) {
        delete[] argv_copy[i];
    }

    // IF DEPRECATION WARNINGS WERE ISSUED TELL THE USER HOW TO TURN THEM OFF

    if ( sc_report_handler::get_count( SC_ID_IEEE_1666_DEPRECATION_ ) > 0 )
    {
        std::stringstream ss;

        const char MSGNL[] = "\n             ";
        const char CODENL[] = "\n  ";

        ss << "You can turn off warnings about" << MSGNL
           << "IEEE 1666 deprecated features by placing this method call" << MSGNL
           << "as the first statement in your sc_main() function:\n" << CODENL
           << "sc_core::sc_report_handler::set_actions( "
           << "\"" << SC_ID_IEEE_1666_DEPRECATION_ << "\"," << CODENL
           << "                                         " /* indent param */
           << "sc_core::SC_DO_NOTHING );"
           << std::endl;

        SC_REPORT_INFO( SC_ID_IEEE_1666_DEPRECATION_, ss.str().c_str() );
    }

    return status;
}